

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch2.hpp
# Opt level: O3

string * __thiscall
Catch::Matchers::StdString::StringMatcherBase::describe_abi_cxx11_
          (string *__return_storage_ptr__,StringMatcherBase *this)

{
  size_type __dnew;
  ulong *local_58;
  ulong local_50;
  ulong local_48 [2];
  ulong local_38;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_58 = local_48;
  if ((this->m_comparator).m_caseSensitivity == No) {
    local_38 = 0x13;
    local_58 = (ulong *)std::__cxx11::string::_M_create((ulong *)&local_58,(ulong)&local_38);
    local_48[0] = local_38;
    *local_58 = 0x6920657361632820;
    local_58[1] = 0x697469736e65736e;
    builtin_strncpy((char *)((long)local_58 + 0xf),"ive)",4);
    local_50 = local_38;
    *(char *)((long)local_58 + local_38) = '\0';
  }
  else {
    local_50 = 0;
    local_48[0] = local_48[0] & 0xffffffffffffff00;
  }
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  if (local_58 != local_48) {
    operator_delete(local_58,local_48[0] + 1);
  }
  std::__cxx11::string::_M_append
            ((char *)__return_storage_ptr__,(ulong)(this->m_operation)._M_dataplus._M_p);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  std::__cxx11::string::_M_append
            ((char *)__return_storage_ptr__,(ulong)(this->m_comparator).m_str._M_dataplus._M_p);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  if ((this->m_comparator).m_caseSensitivity == No) {
    local_38 = 0x13;
    local_58 = local_48;
    local_58 = (ulong *)std::__cxx11::string::_M_create((ulong *)&local_58,(ulong)&local_38);
    local_48[0] = local_38;
    *local_58 = 0x6920657361632820;
    local_58[1] = 0x697469736e65736e;
    builtin_strncpy((char *)((long)local_58 + 0xf),"ive)",4);
    local_50 = local_38;
    *(char *)((long)local_58 + local_38) = '\0';
  }
  else {
    local_50 = 0;
    local_48[0] = local_48[0] & 0xffffffffffffff00;
    local_58 = local_48;
  }
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_58);
  if (local_58 != local_48) {
    operator_delete(local_58,local_48[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string StringMatcherBase::describe() const {
            std::string description;
            description.reserve(5 + m_operation.size() + m_comparator.m_str.size() +
                                        m_comparator.caseSensitivitySuffix().size());
            description += m_operation;
            description += ": \"";
            description += m_comparator.m_str;
            description += "\"";
            description += m_comparator.caseSensitivitySuffix();
            return description;
        }